

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::IsObject(Var instance)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  Type TVar5;
  
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_0099862b;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(instance);
  if (bVar2) {
    TVar5 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)instance >> 0x32 != 0) {
      TVar5 = TypeIds_Number;
      goto LAB_00998554;
    }
    this = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_0099862b;
      *puVar4 = 0;
    }
    TVar5 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar5) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_0099862b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
LAB_00998554:
  return (BOOL)(0x16 < (int)TVar5);
}

Assistant:

BOOL JavascriptOperators::IsObject(_In_ Var instance)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_IsObject);
        return GetTypeId(instance) > TypeIds_LastJavascriptPrimitiveType;
        JIT_HELPER_END(Op_IsObject);
    }